

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayImageTextureSize.cpp
# Opt level: O0

char * __thiscall
glcts::TextureCubeMapArrayTextureSizeRTComputeShader::getComputeShaderCode
          (TextureCubeMapArrayTextureSizeRTComputeShader *this)

{
  TextureCubeMapArrayTextureSizeRTComputeShader *this_local;
  
  return getComputeShaderCode::result;
}

Assistant:

const char* TextureCubeMapArrayTextureSizeRTComputeShader::getComputeShaderCode(void)
{
	static const char* result =
		"${VERSION}\n"
		"\n"
		"${TEXTURE_CUBE_MAP_ARRAY_REQUIRE}\n"
		"\n"
		"precision highp float;\n"
		"\n"
		"layout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n"
		"\n"
		"                               uniform highp samplerCubeArray       texture_std_sampler;\n"
		"                               uniform highp samplerCubeArrayShadow texture_shw_sampler;\n"
		"layout(rgba32f,  binding = 0)  writeonly uniform highp imageCubeArray         texture_img_sampler;\n"
		"\n"
		"layout (rgba32ui, binding = 1) uniform highp writeonly uimage2D image_std_size;\n"
		"layout (rgba32ui, binding = 2) uniform highp writeonly uimage2D image_shw_size;\n"
		"layout (rgba32ui, binding = 3) uniform highp writeonly uimage2D image_img_size;\n"
		"\n"
		"void main(void)\n"
		"{\n"
		"    imageStore(image_std_size, ivec2(0,0),  uvec4(uvec3( textureSize(texture_std_sampler, 0)), 0) );\n"
		"    imageStore(image_shw_size, ivec2(0,0),  uvec4(uvec3( textureSize(texture_shw_sampler, 0)), 0) );\n"
		"    imageStore(image_img_size, ivec2(0,0),  uvec4(uvec3( imageSize  (texture_img_sampler)), 0) );\n"
		"}\n";

	return result;
}